

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

void __thiscall
ps::Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
emit_signal(Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *this,int type_signal)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  int type_signal_local;
  Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *this_local;
  
  l._M_device._4_4_ = type_signal;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m);
  pmVar2 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_signals,(key_type_conflict *)((long)&l._M_device + 4));
  mVar1 = *pmVar2;
  *pmVar2 = mVar1 + 1;
  sVar3 = std::
          vector<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
          ::size(&this->m_topics);
  if (mVar1 + 1 == sVar3) {
    pmVar2 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_signals,(key_type_conflict *)((long)&l._M_device + 4));
    *pmVar2 = 0;
    (**this->_vptr_Publisher)(this,(ulong)l._M_device._4_4_);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void emit_signal(int type_signal)
		{
			std::lock_guard<std::mutex> l{m};
			if (++m_signals[type_signal] == m_topics.size())
			{
				m_signals[type_signal] = 0;
				signal(type_signal);
			}
		}